

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O2

int LZ4_compress_HC_destSize
              (void *state,char *source,char *dest,int *sourceSizePtr,int targetDestSize,int cLevel)

{
  undefined2 uVar1;
  int iVar2;
  LZ4_streamHC_t *LZ4_streamHCPtr;
  
  if (((ulong)state & 7) == 0 && state != (void *)0x0) {
    memset(state,0,0x40030);
    *(undefined2 *)((long)state + 0x40024) = 9;
    LZ4HC_init_internal((LZ4HC_CCtx_internal *)state,(BYTE *)source);
    iVar2 = 0xc;
    if ((uint)cLevel < 0xc) {
      iVar2 = cLevel;
    }
    uVar1 = 9;
    if (0 < cLevel) {
      uVar1 = (short)iVar2;
    }
    *(undefined2 *)((long)state + 0x40024) = uVar1;
    iVar2 = LZ4HC_compress_generic
                      ((LZ4HC_CCtx_internal *)state,source,dest,sourceSizePtr,targetDestSize,cLevel,
                       fillOutput);
  }
  else {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int LZ4_compress_HC_destSize(void* state, const char* source, char* dest, int* sourceSizePtr, int targetDestSize, int cLevel)
{
    LZ4_streamHC_t* const ctx = LZ4_initStreamHC(state, sizeof(*ctx));
    if (ctx==NULL) return 0;   /* init failure */
    LZ4HC_init_internal(&ctx->internal_donotuse, (const BYTE*) source);
    LZ4_setCompressionLevel(ctx, cLevel);
    return LZ4HC_compress_generic(&ctx->internal_donotuse, source, dest, sourceSizePtr, targetDestSize, cLevel, fillOutput);
}